

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int X509V3_add_value_int(char *name,ASN1_INTEGER *aint,stack_st_CONF_VALUE **extlist)

{
  char *value;
  int ret;
  char *strtmp;
  stack_st_CONF_VALUE **extlist_local;
  ASN1_INTEGER *aint_local;
  char *name_local;
  
  if (aint == (ASN1_INTEGER *)0x0) {
    name_local._4_4_ = 1;
  }
  else {
    value = i2s_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,aint);
    if (value == (char *)0x0) {
      name_local._4_4_ = 0;
    }
    else {
      name_local._4_4_ = X509V3_add_value(name,value,extlist);
      OPENSSL_free(value);
    }
  }
  return name_local._4_4_;
}

Assistant:

int X509V3_add_value_int(const char *name, const ASN1_INTEGER *aint,
                         STACK_OF(CONF_VALUE) **extlist) {
  char *strtmp;
  int ret;
  if (!aint) {
    return 1;
  }
  if (!(strtmp = i2s_ASN1_INTEGER(NULL, aint))) {
    return 0;
  }
  ret = X509V3_add_value(name, strtmp, extlist);
  OPENSSL_free(strtmp);
  return ret;
}